

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# as-02-wrap.cpp
# Opt level: O2

CommandOptions * write_timed_text_file(CommandOptions *Options)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  AESEncContext *this;
  HMACContext *this_00;
  long in_RSI;
  _Self __tmp;
  _List_node_base *p_Var11;
  allocator<char> local_369;
  MXFWriter Writer;
  ST2052_TextParser Parser;
  FortunaRNG RNG;
  string XMLDoc;
  WriterInfo Info;
  TimedTextDescriptor TDesc;
  byte_t IV_buf [16];
  FrameBuffer FrameBuffer;
  Result_t local_100 [104];
  Result_t local_98 [104];
  
  AS_02::TimedText::ST2052_TextParser::ST2052_TextParser(&Parser);
  AS_02::TimedText::MXFWriter::MXFWriter(&Writer);
  ASDCP::TimedText::FrameBuffer::FrameBuffer(&FrameBuffer);
  ASDCP::TimedText::TimedTextDescriptor::TimedTextDescriptor(&TDesc);
  AS_02::TimedText::ST2052_TextParser::OpenRead((string *)Options);
  iVar1._0_1_ = Options->error_flag;
  iVar1._1_1_ = Options->key_flag;
  iVar1._2_1_ = Options->asset_id_flag;
  iVar1._3_1_ = Options->encrypt_header_flag;
  if (-1 < iVar1) {
    AS_02::TimedText::ST2052_TextParser::FillTimedTextDescriptor((TimedTextDescriptor *)local_98);
    Kumu::Result_t::~Result_t(local_98);
    TDesc.EditRate = *(Rational *)(in_RSI + 0x18);
    TDesc.ContainerDuration = *(ui32_t *)(in_RSI + 0x10);
    ASDCP::FrameBuffer::Capacity((uint)local_100);
    Kumu::Result_t::~Result_t(local_100);
    if (*(long *)(in_RSI + 0x290) != 0) {
      std::__cxx11::string::_M_assign((string *)&TDesc.NamespaceName);
    }
    if (*(char *)(in_RSI + 5) == '\x01') {
      fputs("IMF Timed-Text Descriptor:\n",_stderr);
      ASDCP::TimedText::DescriptorDump(&TDesc,(_IO_FILE *)0x0);
    }
    iVar2._0_1_ = Options->error_flag;
    iVar2._1_1_ = Options->key_flag;
    iVar2._2_1_ = Options->asset_id_flag;
    iVar2._3_1_ = Options->encrypt_header_flag;
    if (-1 < iVar2) {
      if (*(char *)(in_RSI + 0xc) == '\0') {
        ASDCP::WriterInfo::WriterInfo(&Info,&s_MyInfo.super_WriterInfo);
        Info.LabelSetType = LS_MXF_SMPTE;
        if (*(char *)(in_RSI + 2) == '\x01') {
          Info.AssetUUID._0_8_ = *(undefined8 *)(in_RSI + 0x45);
          Info.AssetUUID._8_8_ = *(undefined8 *)(in_RSI + 0x4d);
        }
        else {
          Kumu::GenRandomUUID(Info.AssetUUID);
        }
        if (*(char *)(in_RSI + 1) == '\x01') {
          Kumu::FortunaRNG::FortunaRNG(&RNG);
          Kumu::GenRandomUUID(Info.ContextID);
          Info.EncryptedEssence = true;
          if (*(char *)(in_RSI + 0x34) == '\x01') {
            Info.CryptographicKeyID._0_8_ = *(undefined8 *)(in_RSI + 0x35);
            Info.CryptographicKeyID._8_8_ = *(undefined8 *)(in_RSI + 0x3d);
          }
          else {
            create_random_uuid(Info.CryptographicKeyID);
          }
          this = (AESEncContext *)operator_new(8);
          ASDCP::AESEncContext::AESEncContext(this);
          ASDCP::AESEncContext::InitKey((uchar *)&XMLDoc);
          Kumu::Result_t::operator=((Result_t *)Options,(Result_t *)&XMLDoc);
          Kumu::Result_t::~Result_t((Result_t *)&XMLDoc);
          iVar3._0_1_ = Options->error_flag;
          iVar3._1_1_ = Options->key_flag;
          iVar3._2_1_ = Options->asset_id_flag;
          iVar3._3_1_ = Options->encrypt_header_flag;
          if (-1 < iVar3) {
            Kumu::FortunaRNG::FillRandom((uchar *)&RNG,(uint)IV_buf);
            ASDCP::AESEncContext::SetIVec((uchar *)&XMLDoc);
            Kumu::Result_t::operator=((Result_t *)Options,(Result_t *)&XMLDoc);
            Kumu::Result_t::~Result_t((Result_t *)&XMLDoc);
            iVar4._0_1_ = Options->error_flag;
            iVar4._1_1_ = Options->key_flag;
            iVar4._2_1_ = Options->asset_id_flag;
            iVar4._3_1_ = Options->encrypt_header_flag;
            if ((-1 < iVar4) && (*(char *)(in_RSI + 4) == '\x01')) {
              Info.UsesHMAC = true;
              this_00 = (HMACContext *)operator_new(8);
              ASDCP::HMACContext::HMACContext(this_00);
              ASDCP::HMACContext::InitKey((uchar *)&XMLDoc,(LabelSet_t)this_00);
              Kumu::Result_t::operator=((Result_t *)Options,(Result_t *)&XMLDoc);
              Kumu::Result_t::~Result_t((Result_t *)&XMLDoc);
            }
          }
          Kumu::FortunaRNG::~FortunaRNG(&RNG);
        }
        iVar5._0_1_ = Options->error_flag;
        iVar5._1_1_ = Options->key_flag;
        iVar5._2_1_ = Options->asset_id_flag;
        iVar5._3_1_ = Options->encrypt_header_flag;
        if (-1 < iVar5) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&RNG,*(char **)(in_RSI + 0x268),&local_369);
          AS_02::TimedText::MXFWriter::OpenWrite
                    ((string *)&XMLDoc,(WriterInfo *)&Writer,(TimedTextDescriptor *)&RNG,(uint)&Info
                    );
          Kumu::Result_t::operator=((Result_t *)Options,(Result_t *)&XMLDoc);
          Kumu::Result_t::~Result_t((Result_t *)&XMLDoc);
          std::__cxx11::string::~string((string *)&RNG);
        }
        ASDCP::WriterInfo::~WriterInfo(&Info);
        iVar6._0_1_ = Options->error_flag;
        iVar6._1_1_ = Options->key_flag;
        iVar6._2_1_ = Options->asset_id_flag;
        iVar6._3_1_ = Options->encrypt_header_flag;
        if (iVar6 < 0) goto LAB_0010d897;
      }
      XMLDoc._M_dataplus._M_p = (pointer)&XMLDoc.field_2;
      XMLDoc._M_string_length = 0;
      XMLDoc.field_2._M_local_buf[0] = '\0';
      AS_02::TimedText::ST2052_TextParser::ReadTimedTextResource((string *)&Info);
      Kumu::Result_t::operator=((Result_t *)Options,(Result_t *)&Info);
      Kumu::Result_t::~Result_t((Result_t *)&Info);
      iVar7._0_1_ = Options->error_flag;
      iVar7._1_1_ = Options->key_flag;
      iVar7._2_1_ = Options->asset_id_flag;
      iVar7._3_1_ = Options->encrypt_header_flag;
      if (-1 < iVar7) {
        AS_02::TimedText::MXFWriter::WriteTimedTextResource
                  ((string *)&Info,(AESEncContext *)&Writer,(HMACContext *)&XMLDoc);
        Kumu::Result_t::operator=((Result_t *)Options,(Result_t *)&Info);
        Kumu::Result_t::~Result_t((Result_t *)&Info);
      }
      for (p_Var11 = TDesc.ResourceList.
                     super__List_base<ASDCP::TimedText::TimedTextResourceDescriptor,_std::allocator<ASDCP::TimedText::TimedTextResourceDescriptor>_>
                     ._M_impl._M_node.super__List_node_base._M_next;
          iVar8._0_1_ = Options->error_flag, iVar8._1_1_ = Options->key_flag,
          iVar8._2_1_ = Options->asset_id_flag, iVar8._3_1_ = Options->encrypt_header_flag,
          p_Var11 != (_List_node_base *)&TDesc.ResourceList; p_Var11 = p_Var11->_M_next) {
        if (iVar8 < 0) goto LAB_0010d88d;
        _RNG = &PTR__IArchive_00118aa8;
        AS_02::TimedText::ST2052_TextParser::ReadAncillaryResource
                  ((UUID *)&Info,(FrameBuffer *)&Parser,(IResourceResolver *)&RNG);
        Kumu::Result_t::operator=((Result_t *)Options,(Result_t *)&Info);
        Kumu::Result_t::~Result_t((Result_t *)&Info);
        iVar9._0_1_ = Options->error_flag;
        iVar9._1_1_ = Options->key_flag;
        iVar9._2_1_ = Options->asset_id_flag;
        iVar9._3_1_ = Options->encrypt_header_flag;
        if (-1 < iVar9) {
          if (*(char *)(in_RSI + 5) == '\x01') {
            ASDCP::TimedText::FrameBuffer::Dump((_IO_FILE *)&FrameBuffer,(uint)_stderr);
          }
          if (*(char *)(in_RSI + 0xc) == '\0') {
            AS_02::TimedText::MXFWriter::WriteAncillaryResource
                      ((FrameBuffer *)&Info,(AESEncContext *)&Writer,(HMACContext *)&FrameBuffer);
            Kumu::Result_t::operator=((Result_t *)Options,(Result_t *)&Info);
            Kumu::Result_t::~Result_t((Result_t *)&Info);
          }
        }
        iVar10._0_1_ = Options->error_flag;
        iVar10._1_1_ = Options->key_flag;
        iVar10._2_1_ = Options->asset_id_flag;
        iVar10._3_1_ = Options->encrypt_header_flag;
        if (iVar10 == Kumu::RESULT_ENDOFFILE) {
          Kumu::Result_t::operator=((Result_t *)Options,(Result_t *)Kumu::RESULT_OK);
        }
      }
      if ((-1 < iVar8) && (*(char *)(in_RSI + 0xc) == '\0')) {
        AS_02::TimedText::MXFWriter::Finalize();
        Kumu::Result_t::operator=((Result_t *)Options,(Result_t *)&Info);
        Kumu::Result_t::~Result_t((Result_t *)&Info);
      }
LAB_0010d88d:
      std::__cxx11::string::~string((string *)&XMLDoc);
    }
  }
LAB_0010d897:
  ASDCP::TimedText::TimedTextDescriptor::~TimedTextDescriptor(&TDesc);
  ASDCP::TimedText::FrameBuffer::~FrameBuffer(&FrameBuffer);
  AS_02::TimedText::MXFWriter::~MXFWriter(&Writer);
  AS_02::TimedText::ST2052_TextParser::~ST2052_TextParser(&Parser);
  return Options;
}

Assistant:

Result_t
write_timed_text_file(CommandOptions& Options)
{
  AESEncContext*    Context = 0;
  HMACContext*      HMAC = 0;
  AS_02::TimedText::ST2052_TextParser  Parser;
  AS_02::TimedText::MXFWriter    Writer;
  TimedText::FrameBuffer  FrameBuffer;
  TimedText::TimedTextDescriptor TDesc;
  byte_t            IV_buf[CBC_BLOCK_SIZE];

  // set up essence parser
  Result_t result = Parser.OpenRead(Options.filenames.front());

  // set up MXF writer
  if ( ASDCP_SUCCESS(result) )
    {
      Parser.FillTimedTextDescriptor(TDesc);
      TDesc.EditRate = Options.edit_rate;
      TDesc.ContainerDuration = Options.duration;
      FrameBuffer.Capacity(Options.fb_size);

      if ( ! Options.profile_name.empty() )
	{
	  TDesc.NamespaceName = Options.profile_name;
	}

      if ( Options.verbose_flag )
	{
	  fputs("IMF Timed-Text Descriptor:\n", stderr);
	  TimedText::DescriptorDump(TDesc);
	}
    }

  if ( ASDCP_SUCCESS(result) && ! Options.no_write_flag )
    {
      WriterInfo Info = s_MyInfo;  // fill in your favorite identifiers here
      Info.LabelSetType = LS_MXF_SMPTE;

      if ( Options.asset_id_flag )
	memcpy(Info.AssetUUID, Options.asset_id_value, UUIDlen);
      else
	Kumu::GenRandomUUID(Info.AssetUUID);

#ifdef HAVE_OPENSSL
      // configure encryption
      if( Options.key_flag )
	{
      Kumu::FortunaRNG  RNG;
	  Kumu::GenRandomUUID(Info.ContextID);
	  Info.EncryptedEssence = true;

	  if ( Options.key_id_flag )
	    {
	      memcpy(Info.CryptographicKeyID, Options.key_id_value, UUIDlen);
	    }
	  else
	    {
	      create_random_uuid(Info.CryptographicKeyID);
	    }

	  Context = new AESEncContext;
	  result = Context->InitKey(Options.key_value);

	  if ( ASDCP_SUCCESS(result) )
	    result = Context->SetIVec(RNG.FillRandom(IV_buf, CBC_BLOCK_SIZE));

	  if ( ASDCP_SUCCESS(result) && Options.write_hmac )
	    {
	      Info.UsesHMAC = true;
	      HMAC = new HMACContext;
	      result = HMAC->InitKey(Options.key_value, Info.LabelSetType);
	    }
	}
#endif // HAVE_OPENSSL

      if ( ASDCP_SUCCESS(result) )
	result = Writer.OpenWrite(Options.out_file.c_str(), Info, TDesc);
    }

  if ( ASDCP_FAILURE(result) )
    return result;

  std::string XMLDoc;
  TimedText::ResourceList_t::const_iterator ri;

  result = Parser.ReadTimedTextResource(XMLDoc);

  if ( ASDCP_SUCCESS(result) )
    result = Writer.WriteTimedTextResource(XMLDoc, Context, HMAC);

  for ( ri = TDesc.ResourceList.begin() ; ri != TDesc.ResourceList.end() && ASDCP_SUCCESS(result); ri++ )
    {
      result = Parser.ReadAncillaryResource((*ri).ResourceID, FrameBuffer);

      if ( ASDCP_SUCCESS(result) )
	{
	  if ( Options.verbose_flag )
	    FrameBuffer.Dump(stderr, Options.fb_dump_size);

	  if ( ! Options.no_write_flag )
	    {
	      result = Writer.WriteAncillaryResource(FrameBuffer, Context, HMAC);

	      // The Writer class will forward the last block of ciphertext
	      // to the encryption context for use as the IV for the next
	      // frame. If you want to use non-sequitur IV values, un-comment
	      // the following  line of code.
	      // if ( ASDCP_SUCCESS(result) && Options.key_flag )
	      //   Context->SetIVec(RNG.FillRandom(IV_buf, CBC_BLOCK_SIZE));
	    }
	}

      if ( result == RESULT_ENDOFFILE )
	result = RESULT_OK;
    }

  if ( ASDCP_SUCCESS(result) && ! Options.no_write_flag )
    result = Writer.Finalize();

  return result;
}